

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O3

string * encode_compute_md5_abi_cxx11_(string *__return_storage_ptr__,char *buf,int len)

{
  mbedtls_md_info_t *md_info;
  size_t sVar1;
  size_t output_len;
  mbedtls_md_context_t ctx;
  char output [512];
  char encoded [512];
  size_t local_460;
  mbedtls_md_context_t local_458;
  uchar local_438 [512];
  uchar local_238 [520];
  
  memset(local_438,0,0x200);
  memset(local_238,0,0x200);
  local_458.md_info = (mbedtls_md_info_t *)0x0;
  local_458.md_ctx = (void *)0x0;
  local_458.hmac_ctx = (void *)0x0;
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
  mbedtls_md_init_ctx(&local_458,md_info);
  mbedtls_md_update(&local_458,(uchar *)buf,(long)len);
  mbedtls_md_finish(&local_458,local_238);
  mbedtls_base64_encode(local_438,0x200,&local_460,local_238,0x10);
  mbedtls_md_free(&local_458);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen((char *)local_438);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_438,local_438 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_md5(char* buf, int len) {
  size_t output_len;
  char output[512] = {};
  char encoded[512] = {};
  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t* md5_md = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);

  mbedtls_md_init_ctx(&ctx, md5_md);
  mbedtls_md_update(&ctx, (const unsigned char*)buf, len);
  mbedtls_md_finish(&ctx, (unsigned char*)encoded);

  mbedtls_base64_encode((unsigned char*)output, sizeof(output), &output_len, (const unsigned char*)encoded, 16);
  mbedtls_md_free(&ctx);
  return output;
}